

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.cpp
# Opt level: O0

string * __thiscall
libtorrent::aux::to_hex_abi_cxx11_(string *__return_storage_ptr__,aux *this,span<const_char> in)

{
  bool bVar1;
  char *in_00;
  index_type iVar2;
  char *out;
  undefined1 local_20 [8];
  span<const_char> in_local;
  string *ret;
  
  in_local.m_ptr = in.m_ptr;
  local_20 = (undefined1  [8])this;
  in_local.m_len = (difference_type)__return_storage_ptr__;
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  bVar1 = span<const_char>::empty((span<const_char> *)local_20);
  if (!bVar1) {
    span<const_char>::size((span<const_char> *)local_20);
    ::std::__cxx11::string::resize((ulong)__return_storage_ptr__);
    in_00 = span<const_char>::data((span<const_char> *)local_20);
    iVar2 = span<const_char>::size((span<const_char> *)local_20);
    out = (char *)::std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    to_hex(in_00,(int)iVar2,out);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_hex(span<char const> in)
	{
		std::string ret;
		if (!in.empty())
		{
			ret.resize(std::size_t(in.size() * 2));
			to_hex(in.data(), int(in.size()), &ret[0]);
		}
		return ret;
	}